

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.h
# Opt level: O2

void xy_x_8tap_32_avx2(uint8_t *src,__m256i *coeffs,__m256i *filt,int16_t *dst)

{
  __m256i data;
  __m256i data_00;
  __m256i *filt_00;
  undefined8 uVar1;
  undefined8 uVar4;
  undefined8 uVar5;
  longlong lVar6;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined8 in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  longlong in_stack_ffffffffffffffc0;
  
  uVar1 = *(undefined8 *)src;
  uVar4 = *(undefined8 *)(src + 8);
  uVar5 = *(undefined8 *)(src + 0x10);
  lVar6 = *(longlong *)(src + 0x18);
  auVar2 = *(undefined1 (*) [32])(src + 8);
  data[1] = in_stack_ffffffffffffffb0;
  data[0] = in_stack_ffffffffffffffa8;
  data[2] = in_stack_ffffffffffffffb8;
  data[3] = in_stack_ffffffffffffffc0;
  x_convolve_8tap_avx2(coeffs,data,filt,filt);
  data_00[1] = uVar4;
  data_00[0] = uVar1;
  data_00[2] = uVar5;
  data_00[3] = lVar6;
  x_convolve_8tap_avx2(coeffs,data_00,filt,filt_00);
  auVar7._8_2_ = 2;
  auVar7._0_8_ = 0x2000200020002;
  auVar7._10_2_ = 2;
  auVar7._12_2_ = 2;
  auVar7._14_2_ = 2;
  auVar7._16_2_ = 2;
  auVar7._18_2_ = 2;
  auVar7._20_2_ = 2;
  auVar7._22_2_ = 2;
  auVar7._24_2_ = 2;
  auVar7._26_2_ = 2;
  auVar7._28_2_ = 2;
  auVar7._30_2_ = 2;
  auVar3._8_8_ = uVar4;
  auVar3._0_8_ = uVar1;
  auVar3._16_8_ = uVar5;
  auVar3._24_8_ = lVar6;
  auVar3 = vpaddw_avx2(auVar7,auVar3);
  auVar8 = vpsraw_avx2(auVar3,2);
  auVar3 = vpaddw_avx2(auVar2,auVar7);
  auVar3 = vpsraw_avx2(auVar3,2);
  *(undefined1 (*) [32])dst = auVar8;
  *(undefined1 (*) [32])(dst + 0x10) = auVar3;
  return;
}

Assistant:

static inline void xy_x_8tap_32_avx2(const uint8_t *const src,
                                     const __m256i coeffs[4],
                                     const __m256i filt[4],
                                     int16_t *const dst) {
  __m256i r[2];

  x_convolve_8tap_32_avx2(src, coeffs, filt, r);
  const __m256i d0 = xy_x_round_avx2(r[0]);
  const __m256i d1 = xy_x_round_avx2(r[1]);
  _mm256_storeu_si256((__m256i *)dst, d0);
  _mm256_storeu_si256((__m256i *)(dst + 16), d1);
}